

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_worker_get_onmessage(JSContext *ctx,JSValue this_val)

{
  long lVar1;
  int *piVar2;
  JSRefCountHeader *p;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  JSValue JVar6;
  undefined8 uStack_10;
  
  pvVar3 = JS_GetOpaque2(ctx,this_val,js_worker_class_id);
  if (pvVar3 == (void *)0x0) {
    uStack_10 = 6;
  }
  else {
    lVar1 = *(long *)((long)pvVar3 + 0x10);
    if (lVar1 != 0) {
      piVar2 = *(int **)(lVar1 + 0x18);
      uStack_10 = *(int64_t *)(lVar1 + 0x20);
      if (0xfffffff4 < (uint)uStack_10) {
        *piVar2 = *piVar2 + 1;
      }
      uVar5 = (ulong)piVar2 & 0xffffffff00000000;
      uVar4 = (ulong)piVar2 & 0xffffffff;
      goto LAB_00110079;
    }
    uStack_10 = 2;
  }
  uVar4 = 0;
  uVar5 = 0;
LAB_00110079:
  JVar6.u.ptr = (void *)(uVar4 | uVar5);
  JVar6.tag = uStack_10;
  return JVar6;
}

Assistant:

static JSValue js_worker_get_onmessage(JSContext *ctx, JSValueConst this_val)
{
    JSWorkerData *worker = JS_GetOpaque2(ctx, this_val, js_worker_class_id);
    JSWorkerMessageHandler *port;
    if (!worker)
        return JS_EXCEPTION;
    port = worker->msg_handler;
    if (port) {
        return JS_DupValue(ctx, port->on_message_func);
    } else {
        return JS_NULL;
    }
}